

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  long lVar1;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters ZStack_38;
  
  ZSTD_getCParams(&ZStack_38,compressionLevel,0,dictSize);
  lVar1 = 1L << ((byte)ZStack_38.chainLog & 0x3f);
  if (ZStack_38.strategy == ZSTD_fast) {
    lVar1 = 0;
  }
  return dictSize + ((1L << ((byte)ZStack_38.hashLog & 0x3f)) + lVar1) * 4 + 0x2b04;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, 0, dictSize);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}